

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxerManager.cpp
# Opt level: O2

bool __thiscall MuxerManager::openMetaFile(MuxerManager *this,string *fileName)

{
  string *opts;
  bool bVar1;
  long lVar2;
  string *line;
  allocator<char> local_b1;
  string *local_b0;
  string str;
  TextFile file;
  string local_50;
  
  local_b0 = fileName;
  TextFile::TextFile(&file,(fileName->_M_dataplus)._M_p,1,0);
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  line = &str;
  TextFile::readLine(&file,line);
  opts = &this->m_muxOpts;
  while (str._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"MUXOPT",&local_b1);
    bVar1 = strStartWith(&str,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)opts);
      parseMuxOpt(this,opts);
      lVar2 = std::__cxx11::string::find((char *)opts,0x205d4a);
      this->m_mvcBaseViewR = lVar2 != -1;
    }
    line = &str;
    TextFile::readLine(&file,&str);
  }
  File::close(&file.super_File,(int)line);
  METADemuxer::openFile(&this->m_metaDemuxer,local_b0);
  std::__cxx11::string::~string((string *)&str);
  File::~File(&file.super_File);
  return true;
}

Assistant:

bool MuxerManager::openMetaFile(const string& fileName)
{
    TextFile file(fileName.c_str(), File::ofRead);
    std::string str;
    file.readLine(str);
    while (str.length() > 0)
    {
        if (strStartWith(str, "MUXOPT"))
        {
            m_muxOpts = str;
            parseMuxOpt(m_muxOpts);
            m_mvcBaseViewR = m_muxOpts.find("right-eye") != string::npos;
        }
        file.readLine(str);
    }
    file.close();

    m_metaDemuxer.openFile(fileName);
    return true;
}